

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::reset_common(Snes_Spc *this,int timer_counter_init)

{
  uint8_t *puVar1;
  long lVar2;
  
  for (lVar2 = 0x865; lVar2 != 0x868; lVar2 = lVar2 + 1) {
    (this->dsp).m.regs[lVar2] = (uint8_t)timer_counter_init;
  }
  (this->m).cpu_regs.psw = 0;
  (this->m).cpu_regs.sp = 0;
  (this->m).cpu_regs.pc = 0;
  (this->m).cpu_regs.a = 0;
  (this->m).cpu_regs.x = 0;
  (this->m).cpu_regs.y = 0;
  (this->m).cpu_regs.pc = 0xffc0;
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 0) = '\n';
  *(uint8_t *)((long)((this->m).smp_regs + 0) + 1) = 0xb0;
  for (lVar2 = 0x85c; lVar2 != 0x860; lVar2 = lVar2 + 1) {
    (this->dsp).m.regs[lVar2] = '\0';
  }
  (this->m).cpu_error = (char *)0x0;
  (this->m).echo_accessed = false;
  (this->m).dsp_time = 0x21;
  (this->m).spc_time = 0;
  for (lVar2 = 0x800; lVar2 != 0x848; lVar2 = lVar2 + 0x18) {
    puVar1 = (this->dsp).m.regs + lVar2;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = (this->dsp).m.regs + lVar2 + 0xc;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
  }
  regs_loaded(this);
  (this->m).extra_clocks = 0;
  reset_buf(this);
  return;
}

Assistant:

void Snes_Spc::reset_common( int timer_counter_init )
{
	int i;
	for ( i = 0; i < timer_count; i++ )
		REGS_IN [r_t0out + i] = timer_counter_init;
	
	// Run IPL ROM
	memset( &m.cpu_regs, 0, sizeof m.cpu_regs );
	m.cpu_regs.pc = rom_addr;
	
	REGS [r_test   ] = 0x0A;
	REGS [r_control] = 0xB0; // ROM enabled, clear ports
	for ( i = 0; i < port_count; i++ )
		REGS_IN [r_cpuio0 + i] = 0;
	
	reset_time_regs();
}